

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_suffix.cc
# Opt level: O1

RegExp * re2c::emit(RangeSuffix *p,RegExp *re)

{
  re2c *this;
  Range *pRVar1;
  RegExp *pRVar2;
  re2c *this_00;
  RegExp *e2;
  pair<std::_Rb_tree_iterator<re2c::RegExp_*>,_bool> pVar3;
  re2c *local_38;
  
  this_00 = (re2c *)re;
  if (p != (RangeSuffix *)0x0) {
    this_00 = (re2c *)0x0;
    do {
      this = (re2c *)operator_new(0x10);
      pRVar1 = Range::ran(p->l,p->h + 1);
      *(undefined ***)this = &PTR__RegExp_0015cd10;
      local_38 = this;
      pVar3 = std::
              _Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
              ::_M_insert_unique<re2c::RegExp*>
                        ((_Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
                          *)RegExp::vFreeList,(RegExp **)&local_38);
      *(undefined ***)this = &PTR__RegExp_0015cbf0;
      *(Range **)(this + 8) = pRVar1;
      pRVar2 = doCat(this,re,pVar3._8_8_);
      pRVar2 = emit(p->child,pRVar2);
      this_00 = (re2c *)doAlt(this_00,pRVar2,e2);
      p = p->next;
    } while (p != (RangeSuffix *)0x0);
  }
  return (RegExp *)this_00;
}

Assistant:

RegExp * emit(RangeSuffix * p, RegExp * re)
{
	if (p == NULL)
		return re;
	else
	{
		RegExp * regexp = NULL;
		for (; p != NULL; p = p->next)
		{
			RegExp * re1 = doCat(new MatchOp(Range::ran (p->l, p->h + 1)), re);
			regexp = doAlt(regexp, emit(p->child, re1));
		}
		return regexp;
	}
}